

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

void __thiscall
expr_tree::expr_tree
          (expr_tree *this,expr_node *_root,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *_parameters,string *_variable,string *_name)

{
  this->root_ = _root;
  tld::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  vector(&this->parameters_,_parameters);
  std::__cxx11::string::string((string *)&this->variable_,(string *)_variable);
  std::__cxx11::string::string((string *)&this->name_,(string *)_name);
  this->errno_ = 0;
  return;
}

Assistant:

expr_tree::expr_tree(expr_node* _root, const tld::vector<std::string>& _parameters, const std::string& _variable, const std::string& _name) :
    root_(_root),
    parameters_(_parameters),
    variable_(_variable),
    name_(_name),
    errno_(T_OK)
{}